

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-string.h
# Opt level: O0

ostream * testing::internal::operator<<(ostream *os,String *str)

{
  char *pcVar1;
  size_t sVar2;
  size_t local_28;
  size_t i;
  char *c_str;
  String *str_local;
  ostream *os_local;
  
  pcVar1 = String::c_str(str);
  if (pcVar1 == (char *)0x0) {
    std::operator<<(os,"(null)");
  }
  else {
    pcVar1 = String::c_str(str);
    for (local_28 = 0; sVar2 = String::length(str), local_28 != sVar2; local_28 = local_28 + 1) {
      if (pcVar1[local_28] == '\0') {
        std::operator<<(os,"\\0");
      }
      else {
        std::operator<<(os,pcVar1[local_28]);
      }
    }
  }
  return os;
}

Assistant:

inline ::std::ostream& operator<<(::std::ostream& os, const String& str) {
  if (str.c_str() == NULL) {
    os << "(null)";
  } else {
    const char* const c_str = str.c_str();
    for (size_t i = 0; i != str.length(); i++) {
      if (c_str[i] == '\0') {
        os << "\\0";
      } else {
        os << c_str[i];
      }
    }
  }
  return os;
}